

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  size_t __n;
  pointer __s1;
  bool bVar2;
  int iVar3;
  FieldDescriptorProto *field;
  OneofDescriptorProto *oneof_decl;
  EnumDescriptorProto *enum_type;
  DescriptorProto *message_00;
  MessageOptions *options;
  size_type __rlen;
  string_view text;
  LocationRecorder location;
  LocationRecorder local_50;
  FileDescriptorProto *local_38;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar2 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar2) {
    return true;
  }
  __n = (this->input_->current_).text._M_string_length;
  uVar1 = __n - 4;
  local_38 = containing_file;
  if (uVar1 < 7) {
    __s1 = (this->input_->current_).text._M_dataplus._M_p;
    switch(uVar1) {
    case 0:
switchD_001cc190_caseD_0:
      iVar3 = bcmp(__s1,"enum",__n);
      if (iVar3 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_50,message_location,4,*(int *)((long)&message->field_0 + 0x40));
        enum_type = (EnumDescriptorProto *)
                    internal::RepeatedPtrFieldBase::AddMessageLite
                              (&(message->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                               Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
        bVar2 = ParseEnumDefinition(this,enum_type,&local_50,local_38);
        goto LAB_001cc2ff;
      }
      switch(__n) {
      case 5:
        goto switchD_001cc190_caseD_1;
      case 6:
        goto switchD_001cc190_caseD_2;
      case 8:
        goto switchD_001cc190_caseD_4;
      case 10:
        goto switchD_001cc190_caseD_6;
      }
      break;
    case 1:
switchD_001cc190_caseD_1:
      iVar3 = bcmp(__s1,"oneof",__n);
      if (iVar3 == 0) {
        iVar3 = *(int *)((long)&message->field_0 + 0x88);
        LocationRecorder::LocationRecorder(&local_50,message_location,8,iVar3);
        oneof_decl = (OneofDescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
        bVar2 = ParseOneof(this,oneof_decl,message,iVar3,&local_50,message_location,local_38);
        goto LAB_001cc2ff;
      }
      break;
    case 2:
switchD_001cc190_caseD_2:
      iVar3 = bcmp(__s1,"extend",__n);
      if (iVar3 == 0) {
        LocationRecorder::LocationRecorder(&local_50,message_location,6);
        bVar2 = ParseExtend(this,&(message->field_0)._impl_.extension_,
                            &(message->field_0)._impl_.nested_type_,message_location,3,&local_50,
                            local_38);
        goto LAB_001cc2ff;
      }
      if (__n == 5) goto switchD_001cc190_caseD_1;
      if ((__n == 6) && (iVar3 = bcmp(__s1,"option",6), iVar3 == 0)) {
        LocationRecorder::LocationRecorder(&local_50,message_location,7);
        options = DescriptorProto::mutable_options(message);
        bVar2 = ParseOption(this,&options->super_Message,&local_50,local_38,OPTION_STATEMENT);
        goto LAB_001cc2ff;
      }
      break;
    case 3:
      iVar3 = bcmp(__s1,"message",__n);
      if (iVar3 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_50,message_location,3,*(int *)((long)&message->field_0 + 0x28));
        message_00 = (DescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
        bVar2 = ParseMessageDefinition(this,message_00,&local_50,local_38);
        goto LAB_001cc2ff;
      }
      switch(uVar1) {
      case 0:
        goto switchD_001cc190_caseD_0;
      case 1:
        goto switchD_001cc190_caseD_1;
      case 2:
        goto switchD_001cc190_caseD_2;
      case 4:
        goto switchD_001cc190_caseD_4;
      case 6:
        goto switchD_001cc190_caseD_6;
      }
      break;
    case 4:
switchD_001cc190_caseD_4:
      iVar3 = bcmp(__s1,"reserved",__n);
      if (iVar3 == 0) {
        bVar2 = ParseReserved(this,message,message_location);
        return bVar2;
      }
      if (__n == 5) goto switchD_001cc190_caseD_1;
      if (__n == 6) goto switchD_001cc190_caseD_2;
      break;
    case 6:
switchD_001cc190_caseD_6:
      iVar3 = bcmp(__s1,"extensions",__n);
      if (iVar3 == 0) {
        LocationRecorder::LocationRecorder(&local_50,message_location,5);
        bVar2 = ParseExtensions(this,message,&local_50,local_38);
        goto LAB_001cc2ff;
      }
      if (__n == 5) goto switchD_001cc190_caseD_1;
      if (__n == 6) goto switchD_001cc190_caseD_2;
      if (__n == 8) goto switchD_001cc190_caseD_4;
    }
  }
  LocationRecorder::LocationRecorder
            (&local_50,message_location,2,*(int *)((long)&message->field_0 + 0x10));
  field = (FieldDescriptorProto *)
          internal::RepeatedPtrFieldBase::AddMessageLite
                    (&(message->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                     Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  bVar2 = ParseMessageField(this,field,&(message->field_0)._impl_.nested_type_,message_location,3,
                            &local_50,local_38);
LAB_001cc2ff:
  LocationRecorder::~LocationRecorder(&local_50);
  return bVar2;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location,
                                  containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(), message_location,
                       DescriptorProto::kNestedTypeFieldNumber, location,
                       containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(
        message_location, DescriptorProto::kOneofDeclFieldNumber, oneof_index);

    return ParseOneof(message->add_oneof_decl(), message, oneof_index,
                      oneof_location, message_location, containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(
        message->add_field(), message->mutable_nested_type(), message_location,
        DescriptorProto::kNestedTypeFieldNumber, location, containing_file);
  }
}